

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void OPN2_EnvelopeSSGEG(ym3438_t *chip)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  
  uVar3 = (ulong)chip->cycles;
  bVar4 = 0;
  chip->eg_ssg_pgrst_latch[uVar3] = '\0';
  chip->eg_ssg_repeat_latch[uVar3] = '\0';
  chip->eg_ssg_hold_up_latch[uVar3] = '\0';
  chip->eg_ssg_inv[uVar3] = '\0';
  bVar1 = chip->ssg_eg[uVar3];
  if ((bVar1 & 8) != 0) {
    bVar2 = chip->eg_ssg_dir[uVar3];
    bVar4 = bVar2;
    if ((*(byte *)((long)chip->eg_level + uVar3 * 2 + 1) & 2) != 0) {
      if ((bVar1 & 3) == 0) {
        chip->eg_ssg_pgrst_latch[uVar3] = '\x01';
      }
      if ((bVar1 & 1) == 0) {
        chip->eg_ssg_repeat_latch[uVar3] = '\x01';
      }
      bVar4 = 1;
      if ((bVar1 & 3) != 3) {
        bVar4 = (bVar1 & 3) == 2 ^ bVar2;
      }
    }
    if ((chip->eg_kon_latch[uVar3] != '\0') && (((bVar1 & 7) == 5 || ((bVar1 & 7) == 3)))) {
      chip->eg_ssg_hold_up_latch[uVar3] = '\x01';
    }
    bVar4 = bVar4 & chip->eg_kon[uVar3];
    chip->eg_ssg_inv[uVar3] = (bVar2 ^ bVar1 >> 2 & 1) & chip->eg_kon[uVar3];
  }
  chip->eg_ssg_dir[uVar3] = bVar4;
  chip->eg_ssg_enable[uVar3] = bVar1 >> 3 & 1;
  return;
}

Assistant:

void OPN2_EnvelopeSSGEG(ym3438_t *chip)
{
    Bit32u slot = chip->cycles;
    Bit8u direction = 0;
    chip->eg_ssg_pgrst_latch[slot] = 0;
    chip->eg_ssg_repeat_latch[slot] = 0;
    chip->eg_ssg_hold_up_latch[slot] = 0;
    chip->eg_ssg_inv[slot] = 0;
    if (chip->ssg_eg[slot] & 0x08)
    {
        direction = chip->eg_ssg_dir[slot];
        if (chip->eg_level[slot] & 0x200)
        {
            /* Reset */
            if ((chip->ssg_eg[slot] & 0x03) == 0x00)
            {
                chip->eg_ssg_pgrst_latch[slot] = 1;
            }
            /* Repeat */
            if ((chip->ssg_eg[slot] & 0x01) == 0x00)
            {
                chip->eg_ssg_repeat_latch[slot] = 1;
            }
            /* Inverse */
            if ((chip->ssg_eg[slot] & 0x03) == 0x02)
            {
                direction ^= 1;
            }
            if ((chip->ssg_eg[slot] & 0x03) == 0x03)
            {
                direction = 1;
            }
        }
        /* Hold up */
        if (chip->eg_kon_latch[slot]
         && ((chip->ssg_eg[slot] & 0x07) == 0x05 || (chip->ssg_eg[slot] & 0x07) == 0x03))
        {
            chip->eg_ssg_hold_up_latch[slot] = 1;
        }
        direction &= chip->eg_kon[slot];
        chip->eg_ssg_inv[slot] = (chip->eg_ssg_dir[slot] ^ ((chip->ssg_eg[slot] >> 2) & 0x01))
                               & chip->eg_kon[slot];
    }
    chip->eg_ssg_dir[slot] = direction;
    chip->eg_ssg_enable[slot] = (chip->ssg_eg[slot] >> 3) & 0x01;
}